

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall CConnman::~CConnman(CConnman *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Interrupt(this);
  Stop(this);
  std::__cxx11::_List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>
  ::_M_clear(&(this->m_reconnections).
              super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>
            );
  std::
  deque<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
  ::~deque(&(this->m_unused_i2p_sessions).c);
  std::vector<CService,_std::allocator<CService>_>::~vector(&this->m_onion_binds);
  std::thread::~thread(&this->threadI2PAcceptIncoming);
  std::thread::~thread(&this->threadMessageHandler);
  std::thread::~thread(&this->threadOpenConnections);
  std::thread::~thread(&this->threadOpenAddedConnections);
  std::thread::~thread(&this->threadSocketHandler);
  std::thread::~thread(&this->threadDNSAddressSeed);
  std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
            (&this->m_i2p_sam_session);
  std::condition_variable::~condition_variable(&(this->interruptNet).cond);
  std::condition_variable::~condition_variable(&this->condMsgProc);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&this->m_anchors);
  std::unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_>::~unique_ptr(&this->semAddnode);
  std::unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_>::~unique_ptr(&this->semOutbound);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_CConnman::CachedAddrResponse>,_std::_Select1st<std::pair<const_unsigned_long,_CConnman::CachedAddrResponse>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CConnman::CachedAddrResponse>_>_>
  ::~_Rb_tree(&(this->m_addr_response_caches)._M_t);
  std::__cxx11::_List_base<CNode_*,_std::allocator<CNode_*>_>::_M_clear
            (&(this->m_nodes_disconnected).super__List_base<CNode_*,_std::allocator<CNode_*>_>);
  std::_Vector_base<CNode_*,_std::allocator<CNode_*>_>::~_Vector_base
            (&(this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>);
  std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>::~vector
            (&this->m_added_node_params);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&this->m_addr_fetches);
  std::vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>::~vector
            (&this->vhListenSocket);
  std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::~vector
            (&this->vWhitelistedRangeOutgoing);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::~vector
              (&this->vWhitelistedRangeIncoming);
    return;
  }
  __stack_chk_fail();
}

Assistant:

CConnman::~CConnman()
{
    Interrupt();
    Stop();
}